

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_sampler_parameterfv(NegativeTestContext *ctx)

{
  allocator<char> local_39;
  float params;
  GLuint sampler;
  string local_30;
  
  params = 0.0;
  sampler = 0;
  glu::CallLogWrapper::glGenSamplers(&ctx->super_CallLogWrapper,1,&sampler);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object returned from a previous call to ctx.glGenSamplers."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glGetSamplerParameterfv(&ctx->super_CallLogWrapper,0xffffffff,0x2800,&params)
  ;
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_ENUM is generated if pname is not an accepted value.",
             &local_39);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glGetSamplerParameterfv
            (&ctx->super_CallLogWrapper,sampler,0xffffffff,&params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteSamplers(&ctx->super_CallLogWrapper,1,&sampler);
  return;
}

Assistant:

void get_sampler_parameterfv (NegativeTestContext& ctx)
{
	float				params	= 0.0f;
	GLuint				sampler = 0;
	ctx.glGenSamplers	(1, &sampler);

	ctx.beginSection("GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object returned from a previous call to ctx.glGenSamplers.");
	ctx.glGetSamplerParameterfv	(-1, GL_TEXTURE_MAG_FILTER, &params);
	ctx.expectError			(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glGetSamplerParameterfv	(sampler, -1, &params);
	ctx.expectError			(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteSamplers(1, &sampler);
}